

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

int32_t utf8IteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int local_5c;
  int local_58;
  int32_t local_50;
  byte local_3d;
  uint8_t __t;
  int32_t limit;
  int iStack_30;
  UBool havePos;
  int32_t i;
  int32_t pos;
  UChar32 c;
  uint8_t *s;
  UCharIteratorOrigin origin_local;
  int32_t delta_local;
  UCharIterator *iter_local;
  
  switch(origin) {
  case UITER_START:
  case UITER_ZERO:
    __t = true;
    iStack_30 = delta;
    break;
  case UITER_CURRENT:
    bVar4 = iter->index < 0;
    if (bVar4) {
      iStack_30 = 0;
    }
    else {
      iStack_30 = iter->index + delta;
    }
    __t = !bVar4;
    break;
  case UITER_LIMIT:
  case UITER_LENGTH:
    if (iter->length < 0) {
      iter->index = -1;
      iter->start = iter->limit;
      iter->reservedField = 0;
      if (-1 < delta) {
        return -2;
      }
      iStack_30 = 0;
      __t = false;
    }
    else {
      iStack_30 = iter->length + delta;
      __t = true;
    }
    break;
  default:
    return -1;
  }
  if ((bool)__t) {
    if (iStack_30 < 1) {
      iter->reservedField = 0;
      iter->start = 0;
      iter->index = 0;
      return 0;
    }
    if ((-1 < iter->length) && (iter->length <= iStack_30)) {
      iter->index = iter->length;
      iter->start = iter->limit;
      iter->reservedField = 0;
      return iter->index;
    }
    if ((iter->index < 0) || (iStack_30 < iter->index / 2)) {
      iter->reservedField = 0;
      iter->start = 0;
      iter->index = 0;
    }
    else if ((-1 < iter->length) && (iter->length - iStack_30 < iStack_30 - iter->index)) {
      iter->index = iter->length;
      iter->start = iter->limit;
      iter->reservedField = 0;
    }
    s._4_4_ = iStack_30 - iter->index;
    if (s._4_4_ == 0) {
      return iter->index;
    }
  }
  else {
    if (delta == 0) {
      return -2;
    }
    if (iter->start <= -delta) {
      iter->reservedField = 0;
      iter->start = 0;
      iter->index = 0;
      return 0;
    }
    s._4_4_ = delta;
    if (iter->limit - iter->start <= delta) {
      iter->index = iter->length;
      iter->start = iter->limit;
      iter->reservedField = 0;
      if (iter->index < 0) {
        local_50 = -2;
      }
      else {
        local_50 = iter->index;
      }
      return local_50;
    }
  }
  _pos = (uint8_t *)iter->context;
  iStack_30 = iter->index;
  limit = iter->start;
  _origin_local = iter;
  if (s._4_4_ < 1) {
    s._0_4_ = origin;
    if (iter->reservedField != 0) {
      iter->reservedField = 0;
      limit = limit + -4;
      iStack_30 = iStack_30 + -1;
      s._4_4_ = s._4_4_ + 1;
    }
    while (s._4_4_ < 0 && 0 < limit) {
      limit = limit + -1;
      i = (int32_t)_pos[limit];
      if ((_pos[limit] & 0x80) != 0) {
        i = utf8_prevCharSafeBody_63(_pos,0,&limit,i,-3);
      }
      if (i < 0x10000) {
        iStack_30 = iStack_30 + -1;
        s._4_4_ = s._4_4_ + 1;
      }
      else {
        if (-2 < s._4_4_) {
          limit = limit + 4;
          _origin_local->reservedField = i;
          iStack_30 = iStack_30 + -1;
          break;
        }
        iStack_30 = iStack_30 + -2;
        s._4_4_ = s._4_4_ + 2;
      }
    }
  }
  else {
    iVar1 = iter->limit;
    if (iter->reservedField != 0) {
      iter->reservedField = 0;
      iStack_30 = iStack_30 + 1;
      s._4_4_ = s._4_4_ + -1;
    }
    while (0 < s._4_4_ && limit < iVar1) {
      iVar3 = limit + 1;
      i = (int32_t)_pos[limit];
      if ((_pos[limit] & 0x80) != 0) {
        if (iVar3 != iVar1) {
          if ((uint)i < 0xe0) {
            if (0xc1 < (uint)i) {
              i = i & 0x1f;
              limit = iVar3;
LAB_003a8dbd:
              iVar3 = limit;
              if ((byte)(_pos[limit] + 0x80) < 0x40) {
                i = i << 6 | (uint)(byte)(_pos[limit] + 0x80);
                iVar3 = limit + 1;
                goto LAB_003a8e04;
              }
            }
          }
          else if ((uint)i < 0xf0) {
            i = i & 0xf;
            if (((int)" 000000000000\x1000"[i] & 1 << (sbyte)((int)(uint)_pos[iVar3] >> 5)) != 0) {
              local_3d = _pos[iVar3] & 0x3f;
              limit = iVar3;
LAB_003a8d84:
              i = i << 6 | (uint)local_3d;
              iVar3 = limit + 1;
              limit = iVar3;
              if (iVar3 != iVar1) goto LAB_003a8dbd;
            }
          }
          else {
            iVar2 = i - 0xf0;
            if ((iVar2 < 5) &&
               (((int)""[(int)(uint)_pos[iVar3] >> 4] & 1 << ((byte)iVar2 & 0x1f)) != 0)) {
              i = iVar2 * 0x40 | _pos[iVar3] & 0x3f;
              limit = limit + 2;
              iVar3 = limit;
              if ((limit != iVar1) && (local_3d = _pos[limit] + 0x80, local_3d < 0x40))
              goto LAB_003a8d84;
            }
          }
        }
        limit = iVar3;
        i = 0xfffd;
        iVar3 = limit;
      }
LAB_003a8e04:
      limit = iVar3;
      if (i < 0x10000) {
        iStack_30 = iStack_30 + 1;
        s._4_4_ = s._4_4_ + -1;
      }
      else {
        if (s._4_4_ < 2) {
          iter->reservedField = i;
          iStack_30 = iStack_30 + 1;
          break;
        }
        iStack_30 = iStack_30 + 2;
        s._4_4_ = s._4_4_ + -2;
      }
    }
    if (limit == iVar1) {
      if ((iter->length < 0) && (-1 < iter->index)) {
        if (iter->reservedField == 0) {
          local_58 = iStack_30;
        }
        else {
          local_58 = iStack_30 + 1;
        }
        iter->length = local_58;
      }
      else if ((iter->index < 0) && (-1 < iter->length)) {
        if (iter->reservedField == 0) {
          local_5c = iter->length;
        }
        else {
          local_5c = iter->length + -1;
        }
        iter->index = local_5c;
      }
    }
  }
  _origin_local->start = limit;
  if (_origin_local->index < 0) {
    if (limit < 2) {
      _origin_local->index = limit;
      iter_local._4_4_ = limit;
    }
    else {
      iter_local._4_4_ = -2;
    }
  }
  else {
    _origin_local->index = iStack_30;
    iter_local._4_4_ = iStack_30;
  }
  return iter_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
utf8IteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    const uint8_t *s;
    UChar32 c;
    int32_t pos; /* requested UTF-16 index */
    int32_t i; /* UTF-8 index */
    UBool havePos;

    /* calculate the requested UTF-16 index */
    switch(origin) {
    case UITER_ZERO:
    case UITER_START:
        pos=delta;
        havePos=TRUE;
        /* iter->index<0 (unknown) is possible */
        break;
    case UITER_CURRENT:
        if(iter->index>=0) {
            pos=iter->index+delta;
            havePos=TRUE;
        } else {
            /* the current UTF-16 index is unknown after setState(), use only delta */
            pos=0;
            havePos=FALSE;
        }
        break;
    case UITER_LIMIT:
    case UITER_LENGTH:
        if(iter->length>=0) {
            pos=iter->length+delta;
            havePos=TRUE;
        } else {
            /* pin to the end, avoid counting the length */
            iter->index=-1;
            iter->start=iter->limit;
            iter->reservedField=0;
            if(delta>=0) {
                return UITER_UNKNOWN_INDEX;
            } else {
                /* the current UTF-16 index is unknown, use only delta */
                pos=0;
                havePos=FALSE;
            }
        }
        break;
    default:
        return -1;  /* Error */
    }

    if(havePos) {
        /* shortcuts: pinning to the edges of the string */
        if(pos<=0) {
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(iter->length>=0 && pos>=iter->length) {
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index;
        }

        /* minimize the number of U8_NEXT/PREV operations */
        if(iter->index<0 || pos<iter->index/2) {
            /* go forward from the start instead of backward from the current index */
            iter->index=iter->start=iter->reservedField=0;
        } else if(iter->length>=0 && (iter->length-pos)<(pos-iter->index)) {
            /*
             * if we have the UTF-16 index and length and the new position is
             * closer to the end than the current index,
             * then go backward from the end instead of forward from the current index
             */
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
        }

        delta=pos-iter->index;
        if(delta==0) {
            return iter->index; /* nothing to do */
        }
    } else {
        /* move relative to unknown UTF-16 index */
        if(delta==0) {
            return UITER_UNKNOWN_INDEX; /* nothing to do */
        } else if(-delta>=iter->start) {
            /* moving backwards by more UChars than there are UTF-8 bytes, pin to 0 */
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(delta>=(iter->limit-iter->start)) {
            /* moving forward by more UChars than the remaining UTF-8 bytes, pin to the end */
            iter->index=iter->length; /* may or may not be <0 (unknown) */
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index>=0 ? iter->index : (int32_t)UITER_UNKNOWN_INDEX;
        }
    }

    /* delta!=0 */

    /* move towards the requested position, pin to the edges of the string */
    s=(const uint8_t *)iter->context;
    pos=iter->index; /* could be <0 (unknown) */
    i=iter->start;
    if(delta>0) {
        /* go forward */
        int32_t limit=iter->limit;
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            ++pos;
            --delta;
        }
        while(delta>0 && i<limit) {
            U8_NEXT_OR_FFFD(s, i, limit, c);
            if(c<=0xffff) {
                ++pos;
                --delta;
            } else if(delta>=2) {
                pos+=2;
                delta-=2;
            } else /* delta==1 */ {
                /* stop in the middle of a supplementary code point */
                iter->reservedField=c;
                ++pos;
                break; /* delta=0; */
            }
        }
        if(i==limit) {
            if(iter->length<0 && iter->index>=0) {
                iter->length= iter->reservedField==0 ? pos : pos+1;
            } else if(iter->index<0 && iter->length>=0) {
                iter->index= iter->reservedField==0 ? iter->length : iter->length-1;
            }
        }
    } else /* delta<0 */ {
        /* go backward */
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            i-=4; /* we stayed behind the supplementary code point; go before it now */
            --pos;
            ++delta;
        }
        while(delta<0 && i>0) {
            U8_PREV_OR_FFFD(s, 0, i, c);
            if(c<=0xffff) {
                --pos;
                ++delta;
            } else if(delta<=-2) {
                pos-=2;
                delta+=2;
            } else /* delta==-1 */ {
                /* stop in the middle of a supplementary code point */
                i+=4; /* back to behind this supplementary code point for consistent state */
                iter->reservedField=c;
                --pos;
                break; /* delta=0; */
            }
        }
    }

    iter->start=i;
    if(iter->index>=0) {
        return iter->index=pos;
    } else {
        /* we started with index<0 (unknown) so pos is bogus */
        if(i<=1) {
            return iter->index=i; /* reached the beginning */
        } else {
            /* we still don't know the UTF-16 index */
            return UITER_UNKNOWN_INDEX;
        }
    }
}